

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnknownHandleManager.cpp
# Opt level: O0

void __thiscall
helics::UnknownHandleManager::clearUnknownsIf
          (UnknownHandleManager *this,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
          *cfunc)

{
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  *in_RSI;
  anon_class_16_2_e720f12a clearCall;
  InterfaceType type;
  undefined7 in_stack_ffffffffffffffe8;
  
  maperase_if<std::unordered_multimap<std::__cxx11::string,std::pair<helics::GlobalHandle,unsigned_short>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>>>,helics::UnknownHandleManager::clearUnknownsIf(std::function<bool(std::__cxx11::string_const&,helics::InterfaceType,std::pair<helics::GlobalHandle,unsigned_short>)>const&)::__0>
            (in_RSI,(anon_class_16_2_e720f12a *)CONCAT17(0x70,in_stack_ffffffffffffffe8));
  maperase_if<std::unordered_multimap<std::__cxx11::string,std::pair<helics::GlobalHandle,unsigned_short>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>>>,helics::UnknownHandleManager::clearUnknownsIf(std::function<bool(std::__cxx11::string_const&,helics::InterfaceType,std::pair<helics::GlobalHandle,unsigned_short>)>const&)::__0>
            (in_RSI,(anon_class_16_2_e720f12a *)CONCAT17(0x65,in_stack_ffffffffffffffe8));
  maperase_if<std::unordered_multimap<std::__cxx11::string,std::pair<helics::GlobalHandle,unsigned_short>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>>>,helics::UnknownHandleManager::clearUnknownsIf(std::function<bool(std::__cxx11::string_const&,helics::InterfaceType,std::pair<helics::GlobalHandle,unsigned_short>)>const&)::__0>
            (in_RSI,(anon_class_16_2_e720f12a *)CONCAT17(0x66,in_stack_ffffffffffffffe8));
  maperase_if<std::unordered_multimap<std::__cxx11::string,std::pair<helics::GlobalHandle,unsigned_short>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>>>,helics::UnknownHandleManager::clearUnknownsIf(std::function<bool(std::__cxx11::string_const&,helics::InterfaceType,std::pair<helics::GlobalHandle,unsigned_short>)>const&)::__0>
            (in_RSI,(anon_class_16_2_e720f12a *)CONCAT17(0x69,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

void UnknownHandleManager::clearUnknownsIf(
    const std::function<bool(const std::string& name, InterfaceType, TargetInfo)>& cfunc)
{
    InterfaceType type = InterfaceType::PUBLICATION;
    auto clearCall = [&cfunc, &type](const auto& it) { return cfunc(it.first, type, it.second); };
    maperase_if(unknown_publications, clearCall);
    type = InterfaceType::ENDPOINT;
    maperase_if(unknown_endpoints, clearCall);
    type = InterfaceType::FILTER;
    maperase_if(unknown_filters, clearCall);
    type = InterfaceType::INPUT;
    maperase_if(unknown_inputs, clearCall);
}